

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O1

void anon_unknown.dwarf_1635f0::testWriteRead(int partNumber)

{
  __type _Var1;
  ostream *poVar2;
  string *psVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing file with ",0x12);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,partNumber);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," part(s).",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::ostream::flush();
  generateRandomFile(partNumber);
  readFirstPart();
  readWholeFiles(0);
  psVar3 = Imf_2_5::Header::type_abi_cxx11_((anonymous_namespace)::headers);
  _Var1 = std::operator==(psVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)Imf_2_5::DEEPSCANLINE_abi_cxx11_);
  if (!_Var1) {
    psVar3 = Imf_2_5::Header::type_abi_cxx11_((anonymous_namespace)::headers);
    _Var1 = std::operator==(psVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)Imf_2_5::DEEPTILE_abi_cxx11_);
    if (!_Var1) {
      modifyType(false);
      readFirstPart();
      std::operator<<((ostream *)&std::cerr," part reading succeeded but should have failed\n");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x54d,"void (anonymous namespace)::testWriteRead(int)");
    }
  }
  modifyType(true);
  readFirstPart();
  std::operator<<((ostream *)&std::cerr," part reading succeeded but should have failed\n");
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                ,0x53a,"void (anonymous namespace)::testWriteRead(int)");
}

Assistant:

void
testWriteRead (int partNumber)
{
    cout << "Testing file with " << partNumber << " part(s)." << endl << flush;

    for(int i=0;i<40;i++)
    {
        generateRandomFile(partNumber);

        try
        {
            readFirstPart();
        }
        catch(std::exception & e)
        {
            cerr << " part reading failed with " << e.what() << " but should have succeeded\n";
            assert(false);
        }
        
        
        readWholeFiles(0);
        
        
        bool caught = false;

        // for deep images, check that "version 2" files don't load
        if(headers[0].type()==DEEPSCANLINE || headers[0].type()==DEEPTILE)
        {
            modifyType(true);
            try
            {
                caught = false;
                readFirstPart();
                cerr << " part reading succeeded but should have failed\n";
                assert(false);
            }
            catch(std::exception & e)
            {
                cout << "recieved exception (" << e.what() << ") as expected\n";
                caught = true;
                // that's what we thought would happen
            }
            assert (caught);
            readWholeFiles(2);
        }
        
        modifyType(false);
        
        try
        {
            caught = false;
            readFirstPart();
            cerr << " part reading succeeded but should have failed\n";
            assert(false);
        }
        catch(std::exception & e)
        {
            cout << "recieved exception (" << e.what() << ") as expected\n";
            caught = true;
            // that's what we thought would happen
        }
        assert (caught);
        
        // this should always succeed: it doesn't try to read the strange new type in part 0
        readWholeFiles(1);
        
        remove (filename.c_str());
        cout << endl << flush;
    }
    
}